

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::negExpr(Parser *this)

{
  Lexer *pLVar1;
  Report *this_00;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  LiteralType args;
  Parser *in_RSI;
  undefined1 local_80 [12];
  Opcode op;
  string local_70;
  SourceLocation loc;
  
  SourceLocation::SourceLocation
            (&loc,&((in_RSI->lexer_)._M_t.
                    super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                    .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  bVar4 = consumeIf(in_RSI,Minus);
  if (bVar4) {
    negExpr((Parser *)local_80);
    if ((_Base_ptr)local_80._0_8_ == (_Base_ptr)0x0) {
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    }
    else {
      op = makeOperator(Minus,(Expr *)local_80._0_8_);
      if (op == EXIT) {
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        this_00 = in_RSI->report_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "Type cast error in unary \'neg\'-operator. Invalid source type <{}>.",
                   (allocator<char> *)&stack0xffffffffffffff8f);
        args = (**(code **)(*(long *)local_80._0_8_ + 0x18))();
        diagnostics::Report::typeError<flow::LiteralType>
                  (this_00,&pLVar1->lastLocation_,&local_70,args);
        std::__cxx11::string::~string((string *)&local_70);
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        if ((_Base_ptr)local_80._0_8_ != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_80._0_8_ + 8))();
        }
      }
      else {
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        loc.end.offset = *(uint *)((long)&(pLVar1->lastLocation_).end + 8);
        loc.end.line = (pLVar1->lastLocation_).end.line;
        loc.end.column = (pLVar1->lastLocation_).end.column;
        std::
        make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                  ((Opcode *)&local_70,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&op,
                   (SourceLocation *)local_80);
        _Var3._M_p = local_70._M_dataplus._M_p;
        uVar2 = local_80._0_8_;
        local_70._M_dataplus._M_p = (pointer)0x0;
        local_80._0_8_ = _Var3._M_p;
        if ((_Base_ptr)uVar2 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)uVar2 + 8))();
          if ((_Base_ptr)local_70._M_dataplus._M_p != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
          }
        }
        *(undefined8 *)&(this->features_)._M_t._M_impl = local_80._0_8_;
      }
    }
  }
  else {
    bitNotExpr(this);
  }
  std::__cxx11::string::~string((string *)&loc);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::negExpr() {
  // negExpr ::= ['-'] primaryExpr
  SourceLocation loc = location();

  if (consumeIf(Token::Minus)) {
    std::unique_ptr<Expr> e = negExpr();
    if (!e) return nullptr;

    Opcode op = makeOperator(Token::Minus, e.get());
    if (op == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error in unary 'neg'-operator. Invalid source type <{}>.",
          e->getType());
      return nullptr;
    }

    e = std::make_unique<UnaryExpr>(op, std::move(e), loc.update(end()));
    return e;
  } else {
    return bitNotExpr();
  }
}